

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::EncryptionAlgorithm::printTo(EncryptionAlgorithm *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  AesGcmV1 *in_stack_00000108;
  string local_68 [55];
  byte local_31;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"EncryptionAlgorithm(");
  std::operator<<(local_10,"AES_GCM_V1=");
  poVar1 = local_10;
  local_31 = 0;
  if ((*(byte *)(in_RDI + 0xa8) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::AesGcmV1>(in_stack_00000108);
    local_31 = 1;
    std::operator<<(poVar1,local_30);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"AES_GCM_CTR_V1=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0xa8) >> 1 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::AesGcmCtrV1>((AesGcmCtrV1 *)in_stack_00000108);
    std::operator<<(poVar1,local_68);
    std::__cxx11::string::~string(local_68);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void EncryptionAlgorithm::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "EncryptionAlgorithm(";
  out << "AES_GCM_V1="; (__isset.AES_GCM_V1 ? (out << to_string(AES_GCM_V1)) : (out << "<null>"));
  out << ", " << "AES_GCM_CTR_V1="; (__isset.AES_GCM_CTR_V1 ? (out << to_string(AES_GCM_CTR_V1)) : (out << "<null>"));
  out << ")";
}